

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O2

bool __thiscall
Fossilize::ExternalReplayer::Impl::is_process_complete(Impl *this,int *return_status)

{
  __pid_t _Var1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  bool bVar5;
  Progress local_90;
  
  if (this->pid == -1) {
    if (return_status == (int *)0x0) {
      return true;
    }
    iVar3 = wstatus_to_return(this->wstatus,this->synthesized_exit_code);
    *return_status = iVar3;
    return true;
  }
  _Var1 = waitpid(this->pid,&this->wstatus,1);
  if (_Var1 == 0) {
LAB_00176f57:
    bVar5 = false;
  }
  else {
    if (_Var1 < 1) {
      piVar4 = __errno_location();
      this->wstatus = -*piVar4;
      this->synthesized_exit_code = true;
    }
    else {
      uVar2 = this->wstatus & 0x7f;
      if ((uVar2 != 0) && ((int)(uVar2 * 0x1000000 + 0x1000000) < 0x2000000)) goto LAB_00176f57;
    }
    poll_progress(this,&local_90);
    reset_pid(this);
    if (return_status != (int *)0x0) {
      iVar3 = wstatus_to_return(this->wstatus,this->synthesized_exit_code);
      *return_status = iVar3;
    }
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool ExternalReplayer::Impl::is_process_complete(int *return_status)
{
	if (pid == -1)
	{
		if (return_status)
			*return_status = wstatus_to_return(wstatus, synthesized_exit_code);
		return true;
	}

	int ret;
	if ((ret = waitpid(pid, &wstatus, WNOHANG)) == 0)
		return false;

	// Child process can receive SIGCONT/SIGSTOP which is benign.
	if (ret > 0 && !WIFEXITED(wstatus) && !WIFSIGNALED(wstatus))
		return false;

	if (ret < 0)
	{
		// If we error out here, we will not be able to receive a functioning return code, so
		// just return -errno.
		wstatus = -errno;
		synthesized_exit_code = true;
	}

	// Pump the fifo through.
	ExternalReplayer::Progress progress = {};
	poll_progress(progress);

	reset_pid();

	if (return_status)
		*return_status = wstatus_to_return(wstatus, synthesized_exit_code);
	return true;
}